

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

void __thiscall LinkedObjectFile::find_code(LinkedObjectFile *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  LinkedObjectFile *in_stack_00000008;
  value_type *word_3;
  size_t j_2;
  int data_label_id;
  value_type *word_2;
  size_t j_1;
  size_t jr_ra_loc;
  bool found_jr_ra;
  uint32_t jr_ra;
  value_type *word_1;
  size_t j;
  size_t function_loc;
  bool found_function;
  int i;
  LinkedWord *word;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  value_type *seg;
  vector<LinkedWord,_std::allocator<LinkedWord>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  size_type local_68;
  ulong local_60;
  size_type local_48;
  size_type local_40;
  int local_34;
  __normal_iterator<LinkedWord_*,_std::vector<LinkedWord,_std::allocator<LinkedWord>_>_> local_20;
  reference local_18;
  reference local_10;
  
  if (*(int *)(in_RDI + 0x58) == 1) {
    local_18 = std::
               vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ::front((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                        *)in_stack_ffffffffffffff40);
    local_10 = local_18;
    local_20._M_current =
         (LinkedWord *)
         std::vector<LinkedWord,_std::allocator<LinkedWord>_>::begin(in_stack_ffffffffffffff38);
    std::vector<LinkedWord,_std::allocator<LinkedWord>_>::end(in_stack_ffffffffffffff38);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<LinkedWord_*,_std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<LinkedWord_*,_std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>
                               *)in_stack_ffffffffffffff38), bVar2) {
      __gnu_cxx::
      __normal_iterator<LinkedWord_*,_std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>::
      operator*(&local_20);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         (bVar2 = std::operator!=(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
         !bVar2)) {
        __assert_fail("word.symbol_name != \"function\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x122,"void LinkedObjectFile::find_code()");
      }
      __gnu_cxx::
      __normal_iterator<LinkedWord_*,_std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>::
      operator++(&local_20);
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    *pvVar5 = 0;
    pvVar6 = std::
             vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
             ::front((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                      *)in_stack_ffffffffffffff40);
    sVar7 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(pvVar6);
    *(int *)(in_RDI + 0x40) = (int)(sVar7 << 2);
    *(undefined4 *)(in_RDI + 0x44) = 0;
  }
  else if (*(int *)(in_RDI + 0x58) == 3) {
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x58); local_34 = local_34 + 1) {
      bVar2 = false;
      local_40 = 0xffffffffffffffff;
      pvVar6 = std::
               vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      local_48 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(pvVar6);
      do {
        sVar7 = local_48 - 1;
        if (local_48 == 0) goto LAB_001aaf1e;
        std::
        vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
        ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
              *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        pvVar8 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                           ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)
                            in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        local_48 = sVar7;
      } while ((pvVar8->kind != TYPE_PTR) ||
              (bVar3 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
              !bVar3));
      bVar2 = true;
      local_40 = sVar7;
LAB_001aaf1e:
      if (bVar2) {
        bVar2 = false;
        local_60 = 0xffffffffffffffff;
        local_68 = local_40;
        while( true ) {
          pvVar6 = std::
                   vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                         *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
          sVar7 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(pvVar6);
          if (sVar7 <= local_68) break;
          std::
          vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
          pvVar8 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                             ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)
                              in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
          if ((pvVar8->kind == PLAIN_DATA) && (pvVar8->data == 0x3e00008)) {
            bVar2 = true;
            local_60 = local_68;
          }
          local_68 = local_68 + 1;
        }
        if (!bVar2) {
          __assert_fail("found_jr_ra",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x14a,"void LinkedObjectFile::find_code()");
        }
        pvVar6 = std::
                 vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                       *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        sVar7 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(pvVar6);
        if (sVar7 <= local_60 + 1) {
          __assert_fail("jr_ra_loc + 1 < words_by_seg.at(i).size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x14b,"void LinkedObjectFile::find_code()");
        }
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        *pvVar5 = (int)local_60 + 2;
      }
      else {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        *pvVar5 = 0;
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      uVar1 = *pvVar5;
      pvVar6 = std::
               vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      sVar7 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(pvVar6);
      if (uVar1 < sVar7) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40,
                   (size_type)in_stack_ffffffffffffff38);
        get_label_id_for(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
        this_00 = std::vector<Label,_std::allocator<Label>_>::at
                            ((vector<Label,_std::allocator<Label>_> *)in_stack_ffffffffffffff40,
                             (size_type)in_stack_ffffffffffffff38);
        std::__cxx11::string::operator=((string *)this_00,"L-data-start");
      }
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)*pvVar5
      ;
      while( true ) {
        in_stack_ffffffffffffff40 = local_80;
        pvVar6 = std::
                 vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                       *)local_80,(size_type)in_stack_ffffffffffffff38);
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(pvVar6);
        if (pbVar9 <= in_stack_ffffffffffffff40) break;
        std::
        vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
        ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
              *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        pvVar8 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                           ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)
                            in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        if ((pvVar8->kind == TYPE_PTR) &&
           (bVar2 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
           bVar2)) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x15d,"void LinkedObjectFile::find_code()");
        }
        local_80 = local_80 + 1;
      }
      pvVar6 = std::
               vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff38 =
           (vector<LinkedWord,_std::allocator<LinkedWord>_> *)
           std::vector<LinkedWord,_std::allocator<LinkedWord>_>::size(pvVar6);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      *(value_type *)(in_RDI + 0x40) =
           *(int *)(in_RDI + 0x40) + ((int)in_stack_ffffffffffffff38 - *pvVar5) * 0x10;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      *(value_type *)(in_RDI + 0x44) = *pvVar5 * 4 + *(int *)(in_RDI + 0x44);
    }
  }
  else if (*(int *)(in_RDI + 0x58) != 0) {
    __assert_fail("segments == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x167,"void LinkedObjectFile::find_code()");
  }
  return;
}

Assistant:

void LinkedObjectFile::find_code() {
  if (segments == 1) {
    // single segment object files should never have any code.
    auto& seg = words_by_seg.front();
    for (auto& word : seg) {
      if (!word.symbol_name.empty()) {
        assert(word.symbol_name != "function");
      }
    }
    offset_of_data_zone_by_seg.at(0) = 0;
    stats.data_bytes = words_by_seg.front().size() * 4;
    stats.code_bytes = 0;

  } else if (segments == 3) {
    // V3 object files will have all the functions, then all the static data.  So to find the
    // divider, we look for the last "function" tag, then find the last jr $ra instruction after
    // that (plus one for delay slot) and assume that after that is data.  Additionally, we check to
    // make sure that there are no "function" type tags in the data section, although this is
    // redundant.
    for (int i = 0; i < segments; i++) {
      // try to find the last reference to "function":
      bool found_function = false;
      size_t function_loc = -1;
      for (size_t j = words_by_seg.at(i).size(); j-- > 0;) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          function_loc = j;
          found_function = true;
          break;
        }
      }

      if (found_function) {
        // look forward until we find "jr ra"
        const uint32_t jr_ra = 0x3e00008;
        bool found_jr_ra = false;
        size_t jr_ra_loc = -1;

        for (size_t j = function_loc; j < words_by_seg.at(i).size(); j++) {
          auto& word = words_by_seg.at(i).at(j);
          if (word.kind == LinkedWord::PLAIN_DATA && word.data == jr_ra) {
            found_jr_ra = true;
            jr_ra_loc = j;
          }
        }

        assert(found_jr_ra);
        assert(jr_ra_loc + 1 < words_by_seg.at(i).size());
        offset_of_data_zone_by_seg.at(i) = jr_ra_loc + 2;

      } else {
        // no functions
        offset_of_data_zone_by_seg.at(i) = 0;
      }

      // add label for debug purposes
      if (offset_of_data_zone_by_seg.at(i) < words_by_seg.at(i).size()) {
        auto data_label_id = get_label_id_for(i, 4 * (offset_of_data_zone_by_seg.at(i)));
        labels.at(data_label_id).name = "L-data-start";
      }

      // verify there are no functions after the data section starts
      for (size_t j = offset_of_data_zone_by_seg.at(i); j < words_by_seg.at(i).size(); j++) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          assert(false);
        }
      }

      // sizes:
      stats.data_bytes += 4 * (words_by_seg.at(i).size() - offset_of_data_zone_by_seg.at(i)) * 4;
      stats.code_bytes += 4 * offset_of_data_zone_by_seg.at(i);
    }
  } else {
    // for files which we couldn't extract link data yet, they will have 0 segments and its ok.
    assert(segments == 0);
  }
}